

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

WildcardPortConnectionSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::WildcardPortConnectionSyntax,slang::syntax::WildcardPortConnectionSyntax_const&>
          (BumpAllocator *this,WildcardPortConnectionSyntax *args)

{
  SyntaxNode *pSVar1;
  size_t sVar2;
  Info *pIVar3;
  Info *pIVar4;
  undefined4 uVar5;
  undefined1 uVar6;
  NumericTokenFlags NVar7;
  uint32_t uVar8;
  TokenKind TVar9;
  undefined1 uVar10;
  NumericTokenFlags NVar11;
  uint32_t uVar12;
  WildcardPortConnectionSyntax *pWVar13;
  
  pWVar13 = (WildcardPortConnectionSyntax *)allocate(this,0x70,8);
  uVar5 = *(undefined4 *)&(args->super_PortConnectionSyntax).super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_PortConnectionSyntax).super_SyntaxNode.parent;
  (pWVar13->super_PortConnectionSyntax).super_SyntaxNode.kind =
       (args->super_PortConnectionSyntax).super_SyntaxNode.kind;
  *(undefined4 *)&(pWVar13->super_PortConnectionSyntax).super_SyntaxNode.field_0x4 = uVar5;
  (pWVar13->super_PortConnectionSyntax).super_SyntaxNode.parent = pSVar1;
  (pWVar13->super_PortConnectionSyntax).super_SyntaxNode.previewNode =
       (args->super_PortConnectionSyntax).super_SyntaxNode.previewNode;
  uVar5 = *(undefined4 *)
           &(args->super_PortConnectionSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.
            field_0x4;
  pSVar1 = (args->super_PortConnectionSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.
           parent;
  (pWVar13->super_PortConnectionSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind =
       (args->super_PortConnectionSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind;
  *(undefined4 *)
   &(pWVar13->super_PortConnectionSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.field_0x4
       = uVar5;
  (pWVar13->super_PortConnectionSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent =
       pSVar1;
  (pWVar13->super_PortConnectionSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.previewNode
       = (args->super_PortConnectionSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.
         previewNode;
  (pWVar13->super_PortConnectionSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_005e7db0;
  (pWVar13->super_PortConnectionSyntax).attributes.super_SyntaxListBase.childCount =
       (args->super_PortConnectionSyntax).attributes.super_SyntaxListBase.childCount;
  sVar2 = (args->super_PortConnectionSyntax).attributes.
          super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
          _M_extent_value;
  (pWVar13->super_PortConnectionSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr =
       (args->super_PortConnectionSyntax).attributes.
       super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
  (pWVar13->super_PortConnectionSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
  _M_extent_value = sVar2;
  (pWVar13->super_PortConnectionSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_005e8088;
  TVar9 = (args->dot).kind;
  uVar10 = (args->dot).field_0x2;
  NVar11.raw = (args->dot).numFlags.raw;
  uVar12 = (args->dot).rawLen;
  pIVar3 = (args->dot).info;
  uVar6 = (args->star).field_0x2;
  NVar7.raw = (args->star).numFlags.raw;
  uVar8 = (args->star).rawLen;
  pIVar4 = (args->star).info;
  (pWVar13->star).kind = (args->star).kind;
  (pWVar13->star).field_0x2 = uVar6;
  (pWVar13->star).numFlags = (NumericTokenFlags)NVar7.raw;
  (pWVar13->star).rawLen = uVar8;
  (pWVar13->star).info = pIVar4;
  (pWVar13->dot).kind = TVar9;
  (pWVar13->dot).field_0x2 = uVar10;
  (pWVar13->dot).numFlags = (NumericTokenFlags)NVar11.raw;
  (pWVar13->dot).rawLen = uVar12;
  (pWVar13->dot).info = pIVar3;
  return pWVar13;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }